

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.hpp
# Opt level: O1

void __thiscall
deqp::gls::fboc::details::ParamTest<deqp::gls::fboc::details::RenderableParams>::ParamTest
          (ParamTest<deqp::gls::fboc::details::RenderableParams> *this,Context *ctx,Params *params)

{
  ImageFormat IVar1;
  GLenum GVar2;
  RenderableParams *params_00;
  string local_58;
  string local_38;
  
  RenderableParams::getName_abi_cxx11_(&local_38,params,params);
  RenderableParams::getDescription_abi_cxx11_(&local_58,params,params_00);
  tcu::TestCase::TestCase
            ((TestCase *)this,ctx->m_testCtx,local_38._M_dataplus._M_p,local_58._M_dataplus._M_p);
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d540e8;
  (this->super_TestBase).m_ctx = ctx;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d54330;
  GVar2 = params->bufType;
  IVar1 = params->format;
  (this->m_params).attPoint = params->attPoint;
  (this->m_params).bufType = GVar2;
  (this->m_params).format = IVar1;
  return;
}

Assistant:

ParamTest		(Context& ctx, const Params& params)
					: TestBase	(ctx, Params::getName(params), Params::getDescription(params))
					, m_params	(params) {}